

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcalendarwidget.cpp
# Opt level: O0

void __thiscall
QCalendarWidgetPrivate::_q_slotChangeDate(QCalendarWidgetPrivate *this,QDate date,bool changeMonth)

{
  QDate date_00;
  byte bVar1;
  bool bVar2;
  byte in_DL;
  QCalendarWidgetPrivate *in_RDI;
  long in_FS_OFFSET;
  QCalendarWidget *q;
  QDate newDate;
  QDate oldDate;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  QDate in_stack_ffffffffffffffa8;
  undefined7 in_stack_ffffffffffffffb0;
  qint64 local_28 [2];
  qint64 local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = in_DL & 1;
  local_18 = (in_RDI->m_model->m_date).jd;
  QtPrivate::QCalendarModel::setDate((QCalendarModel *)in_RDI,in_stack_ffffffffffffffa8);
  local_28[0] = (in_RDI->m_model->m_date).jd;
  if ((bVar1 & 1) != 0) {
    in_stack_ffffffffffffff9c = QDate::year(local_28,*(undefined8 *)&in_RDI->m_model->m_calendar);
    QDate::month(local_28,*(undefined8 *)&in_RDI->m_model->m_calendar);
    showMonth((QCalendarWidgetPrivate *)CONCAT17(bVar1,in_stack_ffffffffffffffb0),
              (int)((ulong)in_stack_ffffffffffffffa8.jd >> 0x20),(int)in_stack_ffffffffffffffa8.jd);
  }
  bVar2 = ::operator!=((QDate *)in_RDI,
                       (QDate *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  if (bVar2) {
    update((QCalendarWidgetPrivate *)CONCAT17(bVar1,in_stack_ffffffffffffffb0));
    q_func(in_RDI);
    date_00.jd._4_4_ = in_stack_ffffffffffffff9c;
    date_00.jd._0_4_ = in_stack_ffffffffffffff98;
    QtPrivate::QCalendarTextNavigator::setDate((QCalendarTextNavigator *)0x51d9e0,date_00);
    QCalendarWidget::selectionChanged((QCalendarWidget *)0x51d9ea);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QCalendarWidgetPrivate::_q_slotChangeDate(QDate date, bool changeMonth)
{
    QDate oldDate = m_model->m_date;
    m_model->setDate(date);
    QDate newDate = m_model->m_date;
    if (changeMonth)
        showMonth(newDate.year(m_model->m_calendar), newDate.month(m_model->m_calendar));
    if (oldDate != newDate) {
        update();
        Q_Q(QCalendarWidget);
        m_navigator->setDate(newDate);
        emit q->selectionChanged();
    }
}